

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O0

bool __thiscall
draco::RAnsSymbolEncoder<8>::Create
          (RAnsSymbolEncoder<8> *this,uint64_t *frequencies,int num_symbols,EncoderBuffer *buffer)

{
  undefined8 uVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  int in_EDX;
  long in_RSI;
  vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *in_RDI;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double norm_prob;
  int i_4;
  double num_bits;
  int i_3;
  uint32_t total_prob;
  int32_t fix;
  int32_t new_prob;
  int symbol_id;
  int j;
  double act_rel_error_d;
  double act_total_prob_d;
  int32_t error;
  int i_2;
  vector<int,_std::allocator<int>_> sorted_probabilities;
  uint32_t rans_prob;
  double prob;
  uint64_t freq;
  int i_1;
  int total_rans_prob;
  double rans_precision_d;
  double total_freq_d;
  int i;
  int max_valid_symbol;
  uint64_t total_freq;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  uint32_t uVar11;
  ProbabilityLess in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int local_f4;
  double local_f0;
  int local_e4;
  uint32_t local_e0;
  int local_dc;
  int local_cc;
  int local_b4;
  ProbabilityLess local_b0;
  int *local_a8;
  int *local_a0;
  int local_98;
  vector<int,_std::allocator<int>_> local_80;
  uint32_t local_64;
  double local_60;
  long local_58;
  int local_50;
  int local_4c;
  undefined8 local_48;
  double local_40;
  int local_38;
  int local_34;
  long local_30;
  int local_1c;
  long local_18;
  byte local_1;
  
  local_30 = 0;
  local_34 = 0;
  for (local_38 = 0; local_38 < in_EDX; local_38 = local_38 + 1) {
    local_30 = *(long *)(in_RSI + (long)local_38 * 8) + local_30;
    if (*(long *)(in_RSI + (long)local_38 * 8) != 0) {
      local_34 = local_38;
    }
  }
  local_1c = local_34 + 1;
  *(int *)&in_RDI[1].super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
           super__Vector_impl_data._M_start = local_1c;
  local_18 = in_RSI;
  std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::resize
            ((vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *)
             in_stack_fffffffffffffed0._M_current,
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  auVar8._8_4_ = (int)((ulong)local_30 >> 0x20);
  auVar8._0_8_ = local_30;
  auVar8._12_4_ = 0x45300000;
  local_40 = (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0);
  local_48 = 0x40b0000000000000;
  local_4c = 0;
  for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
    local_58 = *(long *)(local_18 + (long)local_50 * 8);
    auVar9._8_4_ = (int)((ulong)local_58 >> 0x20);
    auVar9._0_8_ = local_58;
    auVar9._12_4_ = 0x45300000;
    local_60 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0)) / local_40;
    local_64 = (uint32_t)(long)(local_60 * 4096.0 + 0.5);
    if ((local_64 == 0) && (local_58 != 0)) {
      local_64 = 1;
    }
    uVar11 = local_64;
    pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                       (in_RDI,(long)local_50);
    pvVar4->prob = uVar11;
    local_4c = local_64 + local_4c;
  }
  if (local_4c != 0x1000) {
    std::allocator<int>::allocator((allocator<int> *)0x2770f6);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current,
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (allocator_type *)in_stack_fffffffffffffec0.probabilities);
    std::allocator<int>::~allocator((allocator<int> *)0x27711c);
    for (local_98 = 0; local_98 < local_1c; local_98 = local_98 + 1) {
      in_stack_fffffffffffffedc = local_98;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(long)local_98);
      *pvVar5 = in_stack_fffffffffffffedc;
    }
    in_stack_fffffffffffffed0._M_current = (int *)&local_80;
    local_a0 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffea8);
    local_a8 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffea8);
    ProbabilityLess::ProbabilityLess(&local_b0,in_RDI);
    __last._M_current._4_4_ = in_stack_fffffffffffffecc;
    __last._M_current._0_4_ = in_stack_fffffffffffffec8;
    std::
    stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,draco::RAnsSymbolEncoder<8>::ProbabilityLess>
              (in_stack_fffffffffffffed0,__last,in_stack_fffffffffffffec0);
    if (0xfff < local_4c) {
      local_b4 = local_4c + -0x1000;
      do {
        if (local_b4 < 1) goto LAB_00277474;
        dVar6 = (double)local_4c;
        local_cc = local_1c;
        do {
          local_cc = local_cc + -1;
          if (local_cc < 1) break;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(long)local_cc);
          iVar3 = *pvVar5;
          pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                             (in_RDI,(long)iVar3);
          if (pvVar4->prob < 2) {
            if (local_cc == local_1c + -1) {
              local_1 = 0;
              bVar2 = true;
              goto LAB_0027747f;
            }
            break;
          }
          in_stack_fffffffffffffec0.probabilities =
               (vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *)(4096.0 / dVar6);
          pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                             (in_RDI,(long)iVar3);
          dVar7 = floor((double)in_stack_fffffffffffffec0.probabilities * (double)pvVar4->prob);
          pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                             (in_RDI,(long)iVar3);
          local_dc = pvVar4->prob - (int)dVar7;
          if (local_dc == 0) {
            local_dc = 1;
          }
          pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                             (in_RDI,(long)iVar3);
          if ((int)pvVar4->prob <= local_dc) {
            pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                               (in_RDI,(long)iVar3);
            local_dc = pvVar4->prob - 1;
          }
          if (local_b4 < local_dc) {
            local_dc = local_b4;
          }
          pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                             (in_RDI,(long)iVar3);
          pvVar4->prob = pvVar4->prob - local_dc;
          local_4c = local_4c - local_dc;
          local_b4 = local_b4 - local_dc;
        } while (local_4c != 0x1000);
      } while( true );
    }
    iVar3 = 0x1000 - local_4c;
    pvVar5 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                       (in_RDI,(long)*pvVar5);
    pvVar4->prob = iVar3 + pvVar4->prob;
LAB_00277474:
    bVar2 = false;
LAB_0027747f:
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0.probabilities);
    if (bVar2) goto LAB_00277653;
  }
  local_e0 = 0;
  for (local_e4 = 0; local_e4 < local_1c; local_e4 = local_e4 + 1) {
    uVar11 = local_e0;
    pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                       (in_RDI,(long)local_e4);
    pvVar4->cum_prob = uVar11;
    pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                       (in_RDI,(long)local_e4);
    local_e0 = pvVar4->prob + local_e0;
  }
  if (local_e0 == 0x1000) {
    local_f0 = 0.0;
    for (local_f4 = 0; local_f4 < local_1c; local_f4 = local_f4 + 1) {
      pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                         (in_RDI,(long)local_f4);
      if (pvVar4->prob != 0) {
        pvVar4 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                           (in_RDI,(long)local_f4);
        uVar1 = *(undefined8 *)(local_18 + (long)local_f4 * 8);
        auVar10._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar10._0_8_ = uVar1;
        auVar10._12_4_ = 0x45300000;
        dVar6 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        dVar7 = log2((double)pvVar4->prob * 0.000244140625);
        local_f0 = dVar6 * dVar7 + local_f0;
      }
    }
    dVar6 = ceil(-local_f0);
    in_RDI[1].super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f);
    bVar2 = EncodeTable((RAnsSymbolEncoder<8> *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        (EncoderBuffer *)in_stack_fffffffffffffed0._M_current);
    if (bVar2) {
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_00277653:
  return (bool)(local_1 & 1);
}

Assistant:

bool RAnsSymbolEncoder<unique_symbols_bit_length_t>::Create(
    const uint64_t *frequencies, int num_symbols, EncoderBuffer *buffer) {
  // Compute the total of the input frequencies.
  uint64_t total_freq = 0;
  int max_valid_symbol = 0;
  for (int i = 0; i < num_symbols; ++i) {
    total_freq += frequencies[i];
    if (frequencies[i] > 0) {
      max_valid_symbol = i;
    }
  }
  num_symbols = max_valid_symbol + 1;
  num_symbols_ = num_symbols;
  probability_table_.resize(num_symbols);
  const double total_freq_d = static_cast<double>(total_freq);
  const double rans_precision_d = static_cast<double>(rans_precision_);
  // Compute probabilities by rescaling the normalized frequencies into interval
  // [1, rans_precision - 1]. The total probability needs to be equal to
  // rans_precision.
  int total_rans_prob = 0;
  for (int i = 0; i < num_symbols; ++i) {
    const uint64_t freq = frequencies[i];

    // Normalized probability.
    const double prob = static_cast<double>(freq) / total_freq_d;

    // RAns probability in range of [1, rans_precision - 1].
    uint32_t rans_prob = static_cast<uint32_t>(prob * rans_precision_d + 0.5f);
    if (rans_prob == 0 && freq > 0) {
      rans_prob = 1;
    }
    probability_table_[i].prob = rans_prob;
    total_rans_prob += rans_prob;
  }
  // Because of rounding errors, the total precision may not be exactly accurate
  // and we may need to adjust the entries a little bit.
  if (total_rans_prob != rans_precision_) {
    std::vector<int> sorted_probabilities(num_symbols);
    for (int i = 0; i < num_symbols; ++i) {
      sorted_probabilities[i] = i;
    }
    std::stable_sort(sorted_probabilities.begin(), sorted_probabilities.end(),
                     ProbabilityLess(&probability_table_));
    if (total_rans_prob < rans_precision_) {
      // This happens rather infrequently, just add the extra needed precision
      // to the most frequent symbol.
      probability_table_[sorted_probabilities.back()].prob +=
          rans_precision_ - total_rans_prob;
    } else {
      // We have over-allocated the precision, which is quite common.
      // Rescale the probabilities of all symbols.
      int32_t error = total_rans_prob - rans_precision_;
      while (error > 0) {
        const double act_total_prob_d = static_cast<double>(total_rans_prob);
        const double act_rel_error_d = rans_precision_d / act_total_prob_d;
        for (int j = num_symbols - 1; j > 0; --j) {
          int symbol_id = sorted_probabilities[j];
          if (probability_table_[symbol_id].prob <= 1) {
            if (j == num_symbols - 1) {
              return false;  // Most frequent symbol would be empty.
            }
            break;
          }
          const int32_t new_prob = static_cast<int32_t>(
              floor(act_rel_error_d *
                    static_cast<double>(probability_table_[symbol_id].prob)));
          int32_t fix = probability_table_[symbol_id].prob - new_prob;
          if (fix == 0u) {
            fix = 1;
          }
          if (fix >= static_cast<int32_t>(probability_table_[symbol_id].prob)) {
            fix = probability_table_[symbol_id].prob - 1;
          }
          if (fix > error) {
            fix = error;
          }
          probability_table_[symbol_id].prob -= fix;
          total_rans_prob -= fix;
          error -= fix;
          if (total_rans_prob == rans_precision_) {
            break;
          }
        }
      }
    }
  }

  // Compute the cumulative probability (cdf).
  uint32_t total_prob = 0;
  for (int i = 0; i < num_symbols; ++i) {
    probability_table_[i].cum_prob = total_prob;
    total_prob += probability_table_[i].prob;
  }
  if (total_prob != rans_precision_) {
    return false;
  }

  // Estimate the number of bits needed to encode the input.
  // From Shannon entropy the total number of bits N is:
  //   N = -sum{i : all_symbols}(F(i) * log2(P(i)))
  // where P(i) is the normalized probability of symbol i and F(i) is the
  // symbol's frequency in the input data.
  double num_bits = 0;
  for (int i = 0; i < num_symbols; ++i) {
    if (probability_table_[i].prob == 0) {
      continue;
    }
    const double norm_prob =
        static_cast<double>(probability_table_[i].prob) / rans_precision_d;
    num_bits += static_cast<double>(frequencies[i]) * log2(norm_prob);
  }
  num_expected_bits_ = static_cast<uint64_t>(ceil(-num_bits));
  if (!EncodeTable(buffer)) {
    return false;
  }
  return true;
}